

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<unsigned_long_long>>
               (char *label_id,GetterXsYs<unsigned_long_long> *getter,double width)

{
  ImPlotNextItemData *col;
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  bool bVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col_00;
  ImU32 col_01;
  long lVar6;
  ImDrawList *this;
  int iVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_60;
  ImVec2 local_50;
  double local_48;
  double dStack_40;
  
  bVar5 = BeginItem(label_id,1);
  if (bVar5) {
    dVar9 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        auVar10._8_4_ = (int)(uVar1 >> 0x20);
        auVar10._0_8_ = uVar1;
        auVar10._12_4_ = 0x45300000;
        dStack_40 = auVar10._8_8_ - 1.9342813113834067e+25;
        local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        auVar11._8_4_ = (int)(uVar1 >> 0x20);
        auVar11._0_8_ = uVar1;
        auVar11._12_4_ = 0x45300000;
        local_60.y = (auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        local_60.x = local_48 - dVar9;
        FitPoint(&local_60);
        local_60.x = local_48 + dVar9;
        local_60.y = 0.0;
        FitPoint(&local_60);
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 1);
    iVar7 = getter->Count;
    if (0 < iVar7) {
      bVar5 = (pIVar4->NextItemData).RenderFill;
      bVar3 = (pIVar4->NextItemData).RenderLine;
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        if (uVar1 != 0) {
          auVar12._8_4_ = (int)(uVar1 >> 0x20);
          auVar12._0_8_ = uVar1;
          auVar12._12_4_ = 0x45300000;
          uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
          auVar13._8_4_ = (int)(uVar2 >> 0x20);
          auVar13._0_8_ = uVar2;
          auVar13._12_4_ = 0x45300000;
          dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
          local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
          local_60.x = (double)PlotToPixels(local_48 - dVar9,
                                            (auVar12._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,(int)uVar1) -
                                            4503599627370496.0),-1);
          local_50 = PlotToPixels(local_48 + dVar9,0.0,-1);
          if ((pIVar4->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_60,&local_50,col_01,0.0,0xf);
          }
          if (((bVar5 ^ 1U | col_00 != col_01) & bVar3) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_60,&local_50,col_00,0.0,0xf,
                                (pIVar4->NextItemData).LineWeight);
          }
        }
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}